

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blkarray_list.c
# Opt level: O3

void blkarray_list_reset(blkarray_list_t *bl)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  
  iVar1 = bl->cur_row;
  uVar2 = 0;
  if (0 < iVar1) {
    do {
      if (0 < bl->blksize) {
        lVar3 = 0;
        do {
          ckd_free(bl->ptr[uVar2][lVar3]);
          lVar3 = lVar3 + 1;
        } while (lVar3 < bl->blksize);
      }
      ckd_free(bl->ptr[uVar2]);
      bl->ptr[uVar2] = (void **)0x0;
      uVar2 = uVar2 + 1;
      iVar1 = bl->cur_row;
    } while ((long)uVar2 < (long)iVar1);
  }
  if ((int)uVar2 == iVar1) {
    uVar2 = uVar2 & 0xffffffff;
    if (0 < bl->cur_row_free) {
      lVar3 = 0;
      do {
        ckd_free(bl->ptr[uVar2][lVar3]);
        lVar3 = lVar3 + 1;
      } while (lVar3 < bl->cur_row_free);
    }
    ckd_free(bl->ptr[uVar2]);
    bl->ptr[uVar2] = (void **)0x0;
  }
  bl->n_valid = 0;
  bl->cur_row = -1;
  bl->cur_row_free = bl->blksize;
  return;
}

Assistant:

void
blkarray_list_reset(blkarray_list_t * bl)
{
    int32 i, j;

    /* Free all the allocated elements as well as the blocks */
    for (i = 0; i < bl->cur_row; i++) {
        for (j = 0; j < bl->blksize; j++)
            ckd_free(bl->ptr[i][j]);

        ckd_free(bl->ptr[i]);
        bl->ptr[i] = NULL;
    }
    if (i == bl->cur_row) {     /* NEED THIS! (in case cur_row < 0) */
        for (j = 0; j < bl->cur_row_free; j++)
            ckd_free(bl->ptr[i][j]);

        ckd_free(bl->ptr[i]);
        bl->ptr[i] = NULL;
    }

    bl->n_valid = 0;
    bl->cur_row = -1;
    bl->cur_row_free = bl->blksize;
}